

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_>::
freeData(Span<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_> *this)

{
  byte bVar1;
  Entry *pEVar2;
  int *piVar3;
  void *pvVar4;
  Entry *pEVar5;
  long lVar6;
  
  if (this->entries != (Entry *)0x0) {
    lVar6 = 0;
    do {
      bVar1 = this->offsets[lVar6];
      if (bVar1 != 0xff) {
        pEVar2 = this->entries;
        piVar3 = *(int **)(pEVar2[bVar1].storage.data + 0x18);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            (**(code **)(piVar3 + 2))(0,piVar3,0,0,0);
          }
        }
        pEVar5 = pEVar2 + bVar1;
        (pEVar5->storage).data[0x18] = '\0';
        (pEVar5->storage).data[0x19] = '\0';
        (pEVar5->storage).data[0x1a] = '\0';
        (pEVar5->storage).data[0x1b] = '\0';
        (pEVar5->storage).data[0x1c] = '\0';
        (pEVar5->storage).data[0x1d] = '\0';
        (pEVar5->storage).data[0x1e] = '\0';
        (pEVar5->storage).data[0x1f] = '\0';
        piVar3 = *(int **)(pEVar2[bVar1].storage.data + 8);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if ((*piVar3 == 0) &&
             (pvVar4 = *(void **)(pEVar2[bVar1].storage.data + 8), pvVar4 != (void *)0x0)) {
            operator_delete(pvVar4);
          }
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x80);
    if (this->entries != (Entry *)0x0) {
      operator_delete__(this->entries);
    }
    this->entries = (Entry *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }